

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O0

bool __thiscall
gvr::MultiTexturedMesh::getUsedByTexture
          (MultiTexturedMesh *this,int t,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  int in_ESI;
  MultiTexturedMesh *in_RDI;
  int i_2;
  bool ret;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff48;
  int iVar4;
  reference local_98;
  reference local_88;
  reference local_78;
  reference local_68;
  int local_58;
  byte local_51;
  reference local_50;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 __x;
  _Bit_reference in_stack_ffffffffffffffc8;
  int local_24;
  
  __x = (undefined1)((uint)in_stack_ffffffffffffffc4 >> 0x18);
  PointCloud::getVertexCount((PointCloud *)in_RDI);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
             (size_type)in_stack_ffffffffffffffc8._M_p,(bool)__x);
  Mesh::getTriangleCount(&in_RDI->super_Mesh);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
             (size_type)in_stack_ffffffffffffffc8._M_p,(bool)__x);
  local_24 = 0;
  while (iVar4 = local_24, iVar1 = PointCloud::getVertexCount((PointCloud *)in_RDI), iVar4 < iVar1)
  {
    std::vector<bool,_std::allocator<bool>_>::operator[]
              (in_RDX,CONCAT44(iVar4,in_stack_ffffffffffffff48));
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc8,false);
    local_24 = local_24 + 1;
  }
  iVar1 = 0;
  while (iVar3 = iVar1, iVar2 = Mesh::getTriangleCount(&in_RDI->super_Mesh), iVar1 < iVar2) {
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDX,CONCAT44(iVar4,iVar1));
    std::_Bit_reference::operator=(&local_50,false);
    iVar1 = iVar3 + 1;
  }
  local_51 = 0;
  local_58 = Mesh::getTriangleCount(&in_RDI->super_Mesh);
  while (local_58 = local_58 + -1, -1 < local_58) {
    iVar3 = getTextureIndex(in_RDI,local_58);
    if (iVar3 == in_ESI) {
      Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_58,0);
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDX,CONCAT44(iVar4,iVar1));
      std::_Bit_reference::operator=(&local_68,true);
      Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_58,1);
      local_78 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDX,CONCAT44(iVar4,iVar1));
      std::_Bit_reference::operator=(&local_78,true);
      Mesh::getTriangleIndex(&in_RDI->super_Mesh,local_58,2);
      local_88 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDX,CONCAT44(iVar4,iVar1));
      std::_Bit_reference::operator=(&local_88,true);
      local_98 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDX,CONCAT44(iVar4,iVar1));
      std::_Bit_reference::operator=(&local_98,true);
      local_51 = 1;
    }
  }
  return (bool)(local_51 & 1);
}

Assistant:

bool MultiTexturedMesh::getUsedByTexture(int t, std::vector<bool> &vused, std::vector<bool> &tused)
{
  vused.resize(getVertexCount());
  tused.resize(getTriangleCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    tused[i]=false;
  }

  bool ret=false;

  for (int i=getTriangleCount()-1; i>=0; i--)
  {
    if (getTextureIndex(i) == t)
    {
      vused[getTriangleIndex(i, 0)]=true;
      vused[getTriangleIndex(i, 1)]=true;
      vused[getTriangleIndex(i, 2)]=true;
      tused[i]=true;
      ret=true;
    }
  }

  return ret;
}